

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::setOption(Context *this,char *option,char *value)

{
  size_t sVar1;
  char *lvalue;
  String argv;
  anon_union_24_2_13149d16_for_String_2 local_c0;
  anon_union_24_2_13149d16_for_String_2 local_a8;
  anon_union_24_2_13149d16_for_String_2 local_90;
  anon_union_24_2_13149d16_for_String_2 local_78;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  String::String((String *)&local_48.data,"-",1);
  sVar1 = strlen(option);
  String::String((String *)&local_60.data,option,(uint)sVar1);
  operator+((String *)&local_30.data,(String *)&local_48.data,(String *)&local_60.data);
  String::String((String *)&local_78.data,"=",1);
  operator+((String *)&local_c0.data,(String *)&local_30.data,(String *)&local_78.data);
  sVar1 = strlen(value);
  String::String((String *)&local_90.data,value,(uint)sVar1);
  operator+((String *)&local_a8.data,(String *)&local_c0.data,(String *)&local_90.data);
  if ((local_90.buf[0x17] < '\0') && (local_90.data.ptr != (char *)0x0)) {
    operator_delete__(local_90.data.ptr);
  }
  if ((local_c0.buf[0x17] < '\0') && (local_c0.data.ptr != (char *)0x0)) {
    operator_delete__(local_c0.data.ptr);
  }
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_30.buf[0x17] < '\0') && (local_30.data.ptr != (char *)0x0)) {
    operator_delete__(local_30.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
    operator_delete__(local_48.data.ptr);
  }
  local_c0.data.ptr = (char *)&local_a8;
  if (local_a8.buf[0x17] < '\0') {
    local_c0.data.ptr = local_a8.data.ptr;
  }
  parseArgs(this,1,(char **)&local_c0,false);
  if ((local_a8.buf[0x17] < '\0') &&
     ((anon_union_24_2_13149d16_for_String_2 *)local_a8.data.ptr !=
      (anon_union_24_2_13149d16_for_String_2 *)0x0)) {
    operator_delete__(local_a8.data.ptr);
  }
  return;
}

Assistant:

void Context::setOption(const char* option, const char* value) {
    auto argv   = String("-") + option + "=" + value;
    auto lvalue = argv.c_str();
    parseArgs(1, &lvalue);
}